

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Core.cpp
# Opt level: O3

void Rml::Shutdown(void)

{
  long lVar1;
  long lVar2;
  code *pcVar3;
  undefined8 uVar4;
  bool bVar5;
  long lVar6;
  
  if (((initialised != '\0') ||
      (bVar5 = Assert("Rml::Shutdown() called, but RmlUi is not initialised!",
                      "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Core.cpp"
                      ,0xbc), bVar5)) &&
     ((core_data._8_8_ != 0 ||
      (bVar5 = Assert("Resource used before it was initialized, or after it was shut down.",
                      "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                      ,0x46), bVar5)))) {
    robin_hood::detail::
    Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::Context,_Rml::Releaser<Rml::Context>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::clear((Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<Rml::Context,_Rml::Releaser<Rml::Context>_>,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(core_data._8_8_ + 0x38));
    PluginRegistry::NotifyShutdown();
    Factory::Shutdown();
    TemplateCache::Shutdown();
    StyleSheetFactory::Shutdown();
    StyleSheetParser::Shutdown();
    StyleSheetSpecification::Shutdown();
    (**(code **)(*font_interface + 0x18))();
    if ((core_data._8_8_ != 0) ||
       (bVar5 = Assert("Resource used before it was initialized, or after it was shut down.",
                       "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/ControlledLifetimeResource.h"
                       ,0x46), bVar5)) {
      uVar4 = core_data._8_8_;
      lVar1 = *(long *)(core_data._8_8_ + 0x20);
      lVar2 = *(long *)(core_data._8_8_ + 0x28);
      lVar6 = lVar1;
      if (lVar2 != lVar1) {
        do {
          ::std::unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_>::
          ~unique_ptr((unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_> *)
                      (lVar6 + 8));
          lVar6 = lVar6 + 0x10;
        } while (lVar6 != lVar2);
        *(long *)(uVar4 + 0x28) = lVar1;
      }
      Detail::ShutdownObserverPtrPool();
      initialised = 0;
      text_input_handler = 0;
      font_interface = (long *)0x0;
      render_interface = 0;
      file_interface = 0;
      system_interface = 0;
      ControlledLifetimeResource<Rml::CoreData>::Shutdown
                ((ControlledLifetimeResource<Rml::CoreData> *)core_data);
      EventSpecificationInterface::Shutdown();
      ShutdownComputeProperty();
      LayoutPools::Shutdown();
      ElementMetaPool::Shutdown();
      Detail::ShutdownElementInstancerPools();
      return;
    }
  }
  pcVar3 = (code *)invalidInstructionException();
  (*pcVar3)();
}

Assistant:

void Shutdown()
{
	RMLUI_ASSERTMSG(initialised, "Rml::Shutdown() called, but RmlUi is not initialised!");

	// Clear out all contexts, which should also clean up all attached elements.
	core_data->contexts.clear();

	// Notify all plugins we're being shutdown.
	PluginRegistry::NotifyShutdown();

	Factory::Shutdown();
	TemplateCache::Shutdown();
	StyleSheetFactory::Shutdown();
	StyleSheetParser::Shutdown();
	StyleSheetSpecification::Shutdown();

	font_interface->Shutdown();

	core_data->render_managers.clear();

	Detail::ShutdownObserverPtrPool();

	initialised = false;

	text_input_handler = nullptr;
	font_interface = nullptr;
	render_interface = nullptr;
	file_interface = nullptr;
	system_interface = nullptr;

	core_data.Shutdown();

	EventSpecificationInterface::Shutdown();

	ShutdownComputeProperty();
	ReleaseMemoryPools();
}